

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

bp_delta_offsets_t *
duckdb::FSSTStorage::StartScan
          (bp_delta_offsets_t *__return_storage_ptr__,FSSTScanState *scan_state,data_ptr_t base_data
          ,idx_t start,idx_t scan_count)

{
  ulong uVar1;
  _Head_base<0UL,_unsigned_int_*,_false> _Var2;
  idx_t iVar3;
  _Head_base<0UL,_unsigned_int_*,_false> _Var4;
  uint uVar5;
  ulong uVar6;
  
  if ((start == 0) || ((long)start <= scan_state->last_known_row)) {
    scan_state->last_known_index = 0;
    scan_state->last_known_row = -1;
  }
  CalculateBpDeltaOffsets(__return_storage_ptr__,scan_state->last_known_row,start,scan_count);
  uVar1 = __return_storage_ptr__->total_bitunpack_count;
  if (scan_state->bitunpack_buffer_capacity < uVar1) {
    uVar6 = 0xffffffffffffffff;
    if (uVar1 < 0x4000000000000000) {
      uVar6 = uVar1 * 4;
    }
    _Var4._M_head_impl = (uint *)operator_new__(uVar6);
    switchD_0105b559::default(_Var4._M_head_impl,0,uVar6);
    _Var2._M_head_impl =
         (scan_state->bitunpack_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (scan_state->bitunpack_buffer).
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (uint *)0x0) {
      operator_delete__(_Var2._M_head_impl);
    }
    scan_state->bitunpack_buffer_capacity = uVar1;
  }
  BitUnpackRange(base_data,
                 (data_ptr_t)
                 (scan_state->bitunpack_buffer).
                 super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,uVar1,
                 __return_storage_ptr__->bitunpack_start_row,scan_state->current_width);
  uVar1 = __return_storage_ptr__->total_delta_decode_count;
  if (scan_state->delta_decode_capacity < uVar1) {
    uVar6 = 0xffffffffffffffff;
    if (uVar1 < 0x4000000000000000) {
      uVar6 = uVar1 * 4;
    }
    _Var4._M_head_impl = (uint *)operator_new__(uVar6);
    switchD_0105b559::default(_Var4._M_head_impl,0,uVar6);
    _Var2._M_head_impl =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (scan_state->delta_decode_buffer).
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (uint *)0x0) {
      operator_delete__(_Var2._M_head_impl);
    }
    scan_state->delta_decode_capacity = uVar1;
  }
  iVar3 = __return_storage_ptr__->bitunpack_alignment_offset;
  _Var2._M_head_impl =
       (scan_state->bitunpack_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  _Var4._M_head_impl =
       (scan_state->delta_decode_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  *_Var4._M_head_impl = _Var2._M_head_impl[iVar3] + scan_state->last_known_index;
  if (1 < uVar1) {
    uVar5 = *_Var4._M_head_impl;
    uVar6 = 1;
    do {
      uVar5 = uVar5 + _Var2._M_head_impl[iVar3 + uVar6];
      _Var4._M_head_impl[uVar6] = uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

bp_delta_offsets_t FSSTStorage::StartScan(FSSTScanState &scan_state, data_ptr_t base_data, idx_t start,
                                          idx_t scan_count) {
	if (start == 0 || scan_state.last_known_row >= (int64_t)start) {
		scan_state.ResetStoredDelta();
	}

	auto offsets = CalculateBpDeltaOffsets(scan_state.last_known_row, start, scan_count);

	if (scan_state.bitunpack_buffer_capacity < offsets.total_bitunpack_count) {
		scan_state.bitunpack_buffer = make_unsafe_uniq_array<uint32_t>(offsets.total_bitunpack_count);
		scan_state.bitunpack_buffer_capacity = offsets.total_bitunpack_count;
	}
	BitUnpackRange(base_data, data_ptr_cast(scan_state.bitunpack_buffer.get()), offsets.total_bitunpack_count,
	               offsets.bitunpack_start_row, scan_state.current_width);
	if (scan_state.delta_decode_capacity < offsets.total_delta_decode_count) {
		scan_state.delta_decode_buffer = make_unsafe_uniq_array<uint32_t>(offsets.total_delta_decode_count);
		scan_state.delta_decode_capacity = offsets.total_delta_decode_count;
	}
	DeltaDecodeIndices(scan_state.bitunpack_buffer.get() + offsets.bitunpack_alignment_offset,
	                   scan_state.delta_decode_buffer.get(), offsets.total_delta_decode_count,
	                   scan_state.last_known_index);
	return offsets;
}